

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O2

void __thiscall OpenMD::ElementsTable::ParseLine(ElementsTable *this,char *buffer)

{
  Element *this_00;
  allocator<char> local_20d;
  int maxbonds;
  int num;
  char symbol [4];
  RealType blue;
  RealType green;
  RealType red;
  RealType elAffin;
  RealType ARENeg;
  RealType mass;
  RealType Rvdw;
  RealType Rcov;
  string local_170;
  Element *ele;
  RealType ionize;
  RealType elNeg;
  char name [256];
  
  if (*buffer != '#') {
    __isoc99_sscanf(buffer,"%d %3s %lf %lf %*f %lf %d %lf %lf %lf %lf %lf %lf %lf %255s",&num,symbol
                    ,&ARENeg,&Rcov,&Rvdw,&maxbonds,&mass,&elNeg,&ionize,&elAffin,&red,&green,&blue,
                    name);
    this_00 = (Element *)operator_new(0xa0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,name,&local_20d);
    Element::Element(this_00,num,symbol,ARENeg,Rcov,Rvdw,maxbonds,mass,elNeg,ionize,elAffin,red,
                     green,blue,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    ele = this_00;
    std::vector<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>::push_back
              (&this->elements_,&ele);
  }
  return;
}

Assistant:

void ElementsTable::ParseLine(const char* buffer) {
    int num, maxbonds;
    char symbol[4];
    char name[256];
    RealType Rcov, Rvdw, mass, elNeg, ARENeg, ionize, elAffin;
    RealType red, green, blue;

    // skip comment line (at the top)
    if (buffer[0] != '#') {
      sscanf(buffer,
             "%d %3s %lf %lf %*f %lf %d %lf %lf %lf %lf %lf %lf %lf %255s",
             &num, symbol, &ARENeg, &Rcov, &Rvdw, &maxbonds, &mass, &elNeg,
             &ionize, &elAffin, &red, &green, &blue, name);

      Element* ele =
          new Element(num, symbol, ARENeg, Rcov, Rvdw, maxbonds, mass, elNeg,
                      ionize, elAffin, red, green, blue, name);
      elements_.push_back(ele);
    }
  }